

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> * __thiscall
testing::internal::FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
AddNewOnCallSpec(FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,
                char *file,int line,ArgumentMatcherTuple *m)

{
  void *mock_obj;
  OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this_00;
  OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *local_30;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  this_00 = (OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)operator_new(0x50);
  OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::OnCallSpec(this_00,file,line,m);
  local_30 = this_00;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this->super_UntypedFunctionMockerBase).untyped_on_call_specs_,&local_30);
  return this_00;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    OnCallSpec<F>* const on_call_spec = new OnCallSpec<F>(file, line, m);
    untyped_on_call_specs_.push_back(on_call_spec);
    return *on_call_spec;
  }